

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_tonumber(lua_State *L)

{
  byte bVar1;
  int iVar2;
  lua_Integer lVar3;
  byte *__nptr;
  ulong uVar4;
  ushort **ppuVar5;
  StkId pTVar6;
  lua_Number lVar7;
  undefined1 auVar8 [16];
  byte *local_30;
  
  lVar3 = luaL_optinteger(L,2,10);
  iVar2 = (int)lVar3;
  if (iVar2 == 10) {
    luaL_checkany(L,1);
    iVar2 = lua_isnumber(L,1);
    if (iVar2 != 0) {
      lVar7 = lua_tonumber(L,1);
      pTVar6 = L->top;
      (pTVar6->value).n = lVar7;
LAB_001093e2:
      pTVar6->tt = 3;
      L->top = L->top + 1;
      return 1;
    }
  }
  else {
    __nptr = (byte *)luaL_checklstring(L,1,(size_t *)0x0);
    if (0x22 < iVar2 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    uVar4 = strtoul((char *)__nptr,(char **)&local_30,iVar2);
    if (__nptr != local_30) {
      ppuVar5 = __ctype_b_loc();
      do {
        bVar1 = *local_30;
        local_30 = local_30 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
      if (bVar1 == 0) {
        auVar8._8_4_ = (int)(uVar4 >> 0x20);
        auVar8._0_8_ = uVar4;
        auVar8._12_4_ = 0x45300000;
        pTVar6 = L->top;
        (pTVar6->value).n =
             (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        goto LAB_001093e2;
      }
    }
  }
  pTVar6 = L->top;
  pTVar6->tt = 0;
  L->top = pTVar6 + 1;
  return 1;
}

Assistant:

static int luaB_tonumber(lua_State*L){
int base=luaL_optint(L,2,10);
if(base==10){
luaL_checkany(L,1);
if(lua_isnumber(L,1)){
lua_pushnumber(L,lua_tonumber(L,1));
return 1;
}
}
else{
const char*s1=luaL_checkstring(L,1);
char*s2;
unsigned long n;
luaL_argcheck(L,2<=base&&base<=36,2,"base out of range");
n=strtoul(s1,&s2,base);
if(s1!=s2){
while(isspace((unsigned char)(*s2)))s2++;
if(*s2=='\0'){
lua_pushnumber(L,(lua_Number)n);
return 1;
}
}
}
lua_pushnil(L);
return 1;
}